

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

int32_t utrie_unserialize_63(UTrie *trie,void *data,int32_t length,UErrorCode *pErrorCode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t *puVar5;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (U_ZERO_ERROR < *pErrorCode)) {
    return -1;
  }
  if ((0xf < length) &&
     ((*data == 0x54726965 && (uVar1 = *(uint *)((long)data + 4), (char)uVar1 == '%')))) {
    trie->isLatin1Linear = (byte)(uVar1 >> 9) & 1;
    iVar2 = *(int *)((long)data + 8);
    trie->indexLength = iVar2;
    iVar3 = *(int *)((long)data + 0xc);
    trie->dataLength = iVar3;
    iVar4 = length + -0x10 + iVar2 * -2;
    if (SBORROW4(length + -0x10,iVar2 * 2) == iVar4 < 0) {
      trie->index = (uint16_t *)((long)data + 0x10);
      puVar5 = (uint32_t *)((long)data + (long)iVar2 * 2 + 0x10);
      if ((uVar1 >> 8 & 1) == 0) {
        if (SBORROW4(iVar4,iVar3 * 2) == iVar4 + iVar3 * -2 < 0) {
          trie->data32 = (uint32_t *)0x0;
          trie->initialValue = (uint)(ushort)*puVar5;
          iVar2 = (iVar3 + iVar2) * 2;
LAB_002f13b7:
          trie->getFoldingOffset = utrie_defaultGetFoldingOffset_63;
          return iVar2 + 0x10;
        }
      }
      else if (iVar3 * 4 <= iVar4) {
        trie->data32 = puVar5;
        trie->initialValue = *puVar5;
        iVar2 = iVar2 * 2 + iVar3 * 4;
        goto LAB_002f13b7;
      }
    }
  }
  *pErrorCode = U_INVALID_FORMAT_ERROR;
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie_unserialize(UTrie *trie, const void *data, int32_t length, UErrorCode *pErrorCode) {
    const UTrieHeader *header;
    const uint16_t *p16;
    uint32_t options;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return -1;
    }

    /* enough data for a trie header? */
    if(length<(int32_t)sizeof(UTrieHeader)) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return -1;
    }

    /* check the signature */
    header=(const UTrieHeader *)data;
    if(header->signature!=0x54726965) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return -1;
    }

    /* get the options and check the shift values */
    options=header->options;
    if( (options&UTRIE_OPTIONS_SHIFT_MASK)!=UTRIE_SHIFT ||
        ((options>>UTRIE_OPTIONS_INDEX_SHIFT)&UTRIE_OPTIONS_SHIFT_MASK)!=UTRIE_INDEX_SHIFT
    ) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return -1;
    }
    trie->isLatin1Linear= (UBool)((options&UTRIE_OPTIONS_LATIN1_IS_LINEAR)!=0);

    /* get the length values */
    trie->indexLength=header->indexLength;
    trie->dataLength=header->dataLength;

    length-=(int32_t)sizeof(UTrieHeader);

    /* enough data for the index? */
    if(length<2*trie->indexLength) {
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return -1;
    }
    p16=(const uint16_t *)(header+1);
    trie->index=p16;
    p16+=trie->indexLength;
    length-=2*trie->indexLength;

    /* get the data */
    if(options&UTRIE_OPTIONS_DATA_IS_32_BIT) {
        if(length<4*trie->dataLength) {
            *pErrorCode=U_INVALID_FORMAT_ERROR;
            return -1;
        }
        trie->data32=(const uint32_t *)p16;
        trie->initialValue=trie->data32[0];
        length=(int32_t)sizeof(UTrieHeader)+2*trie->indexLength+4*trie->dataLength;
    } else {
        if(length<2*trie->dataLength) {
            *pErrorCode=U_INVALID_FORMAT_ERROR;
            return -1;
        }

        /* the "data16" data is used via the index pointer */
        trie->data32=NULL;
        trie->initialValue=trie->index[trie->indexLength];
        length=(int32_t)sizeof(UTrieHeader)+2*trie->indexLength+2*trie->dataLength;
    }

    trie->getFoldingOffset=utrie_defaultGetFoldingOffset;

    return length;
}